

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O2

attr * SEM_Exp(ast *node)

{
  uint uVar1;
  field_t *pfVar2;
  int iVar3;
  ast *paVar4;
  ast *paVar5;
  ast *node_00;
  attr *paVar6;
  basic_t *pbVar7;
  attr *paVar8;
  char *pcVar9;
  char *buf;
  size_t sVar10;
  size_t sVar11;
  arg_t *paVar12;
  char *pcVar13;
  field_t **ppfVar14;
  arg_t **ppaVar15;
  int iVar16;
  char acStack_48 [24];
  
  pcVar13 = acStack_48;
  do {
    paVar4 = child(node,1);
    paVar5 = child(node,2);
    node_00 = child(node,3);
    iVar3 = paVar4->type;
    uVar1 = iVar3 - 0x102;
    if (0x1a < uVar1) goto LAB_00106c09;
    node = paVar5;
  } while ((0x6080U >> (uVar1 & 0x1f) & 1) != 0);
  if ((3U >> (uVar1 & 0x1f) & 1) != 0) {
    paVar6 = (attr *)malloc(0x10);
    paVar6->kind = 0;
    pbVar7 = (basic_t *)malloc(0x10);
    (paVar6->field_1).basic = pbVar7;
    pbVar7->type = (uint)(iVar3 != 0x102) * 3 + 2;
    pbVar7->name = (char *)0x0;
    return paVar6;
  }
  if (uVar1 == 0x1a) {
    paVar6 = findvar(paVar4->val->typeval);
    if (node_00 == (ast *)0x0) {
      if (paVar6 != (attr *)0x0) {
        return paVar6;
      }
      iVar3 = paVar4->pos->first_line;
      pcVar13 = (char *)paVar4->val->numval;
      iVar16 = 1;
      pcVar9 = semErrorMsg[1];
    }
    else if (paVar6 == (attr *)0x0) {
      paVar6 = findfunc(paVar4->val->typeval);
      if (paVar6 != (attr *)0x0) {
        pcVar9 = (char *)malloc(0x100);
        buf = (char *)malloc(0x100);
        pcVar13 = paVar4->val->typeval;
        sVar10 = strlen(pcVar13);
        sprintf(pcVar9,"%s(",pcVar13);
        buf[0] = '(';
        buf[1] = '\0';
        paVar5 = sibling(paVar4,2);
        if (paVar5->type != 0x111) {
          for (paVar12 = SEM_Args(paVar5); paVar12 != (arg_t *)0x0; paVar12 = paVar12->next) {
            isFuncMatchCpStr(paVar12->arg,buf);
            sVar11 = strlen(buf);
            (buf + sVar11)[0] = ',';
            (buf + sVar11)[1] = ' ';
            buf[sVar11 + 2] = '\0';
          }
        }
        ppaVar15 = &((paVar6->field_1).function)->arg_list;
        while (paVar12 = *ppaVar15, paVar12 != (arg_t *)0x0) {
          isFuncMatchCpStr(paVar12->arg,pcVar9);
          sVar11 = strlen(pcVar9);
          (pcVar9 + sVar11)[0] = ',';
          (pcVar9 + sVar11)[1] = ' ';
          pcVar9[sVar11 + 2] = '\0';
          ppaVar15 = &paVar12->next;
        }
        iVar3 = strcmp(pcVar9 + (int)sVar10,buf);
        if (iVar3 != 0) {
          sVar10 = strlen(pcVar9);
          sVar11 = strlen(buf);
          if (pcVar9[(long)((sVar10 << 0x20) + -0x100000000) >> 0x20] != '(') {
            pcVar9[(long)((sVar10 << 0x20) + -0x200000000) >> 0x20] = '\0';
          }
          if (buf[(long)((sVar11 << 0x20) + -0x100000000) >> 0x20] != '(') {
            buf[(long)((sVar11 << 0x20) + -0x200000000) >> 0x20] = '\0';
          }
          sVar10 = strlen(pcVar9);
          (pcVar9 + sVar10)[0] = ')';
          (pcVar9 + sVar10)[1] = '\0';
          sVar10 = strlen(buf);
          (buf + sVar10)[0] = ')';
          (buf + sVar10)[1] = '\0';
          semerror(9,paVar4->pos->first_line,semErrorMsg[9],pcVar9,buf);
        }
        free(pcVar9);
        free(buf);
        return paVar6;
      }
      iVar3 = paVar4->pos->first_line;
      pcVar13 = (char *)paVar4->val->numval;
      iVar16 = 2;
      pcVar9 = semErrorMsg[2];
    }
    else {
      iVar3 = paVar4->pos->first_line;
      pcVar13 = (char *)paVar4->val->numval;
      iVar16 = 0xb;
      pcVar9 = semErrorMsg[0xb];
    }
LAB_00106fdd:
    semerror(iVar16,iVar3,pcVar9,pcVar13);
  }
  else {
LAB_00106c09:
    if (iVar3 != -0x26fd) {
      abort();
    }
    paVar6 = SEM_Exp(paVar4);
    if (paVar6 == (attr *)0x0) {
      return (attr *)0x0;
    }
    if (paVar5->type == 0x10e) {
      if (paVar6->kind == 2) {
        ppfVar14 = &((paVar6->field_1).structure)->field;
        while (pfVar2 = *ppfVar14, pfVar2 != (field_t *)0x0) {
          iVar3 = strcmp(pfVar2->name,node_00->val->typeval);
          if (iVar3 == 0) {
            return pfVar2->type;
          }
          ppfVar14 = &pfVar2->next;
        }
        iVar3 = node_00->pos->first_line;
        pcVar13 = (char *)node_00->val->numval;
        iVar16 = 0xe;
        pcVar9 = semErrorMsg[0xe];
        goto LAB_00106fdd;
      }
      iVar3 = paVar5->pos->first_line;
      iVar16 = 0xd;
      pcVar13 = semErrorMsg[0xd];
    }
    else if (paVar5->type == 0x112) {
      if (paVar6->kind == 1) {
        paVar8 = SEM_Exp(node_00);
        if ((paVar8->kind == 0) && (((paVar8->field_1).basic)->type == 2)) {
          return (attr *)((paVar6->field_1).basic)->name;
        }
        paVar4 = child(node_00,1);
        if (paVar4->type == 0x103) {
          paVar4 = child(node_00,1);
          sprintf(acStack_48,"\"%lg\"",paVar4->val->numval);
        }
        else {
          builtin_strncpy(acStack_48,"Array argument",0xf);
        }
        iVar3 = node_00->pos->first_line;
        iVar16 = 0xc;
        pcVar9 = semErrorMsg[0xc];
        goto LAB_00106fdd;
      }
      iVar3 = paVar4->pos->first_line;
      iVar16 = 10;
      pcVar13 = semErrorMsg[10];
    }
    else {
      paVar8 = SEM_Exp(node_00);
      if (paVar5->type == 0x106) {
        if ((paVar6->kind == 3) ||
           ((paVar6->kind == 0 && (((paVar6->field_1).basic)->name == (char *)0x0)))) {
          iVar3 = paVar4->pos->first_line;
          iVar16 = 6;
          pcVar13 = semErrorMsg[6];
        }
        else {
          if (paVar8 == (attr *)0x0) {
            return paVar6;
          }
          iVar3 = isequal(paVar6,paVar8);
          if (iVar3 != 0) {
            return paVar6;
          }
          iVar3 = paVar5->pos->first_line;
          iVar16 = 5;
          pcVar13 = semErrorMsg[5];
        }
      }
      else {
        if (paVar8 == (attr *)0x0) {
          return paVar6;
        }
        iVar3 = isequal(paVar6,paVar8);
        if (iVar3 != 0) {
          return paVar6;
        }
        iVar3 = paVar5->pos->first_line;
        iVar16 = 7;
        pcVar13 = semErrorMsg[7];
      }
    }
    semerror(iVar16,iVar3,pcVar13);
  }
  return (attr *)0x0;
}

Assistant:

static struct attr* SEM_Exp(struct ast *node) {
    struct ast *child1 = child(node, 1);
    struct ast *child2 = child(node, 2);
    struct ast *child3 = child(node, 3);
    struct attr *a, *b;
    switch (child1->type) {
        case Exp:
            a = SEM_Exp(child1);
            if (a == NULL)
                return NULL;
            if (child2->type != LB && child2->type != DOT) {
                b = SEM_Exp(child3);
                if (child2->type == ASSIGNOP) {
                    if ((a->kind == BASIC && a->basic->name == NULL) || a->kind == FUNCTION) {
                        SEMERROR_NOVA(AssignLeftValue, child1);
                        return NULL;
                    } else if (b && !isequal(a, b)) { //error not match
//                    printf("error type not match\n");
                        SEMERROR_NOVA(AssignMismatch, child2);
                        return NULL;
                    }
                } else { //DONETODO: other types
                    if (b && !isequal(a, b)) { //error not match
//                    printf("error type not match\n");
                        SEMERROR_NOVA(OperandsMismatch, child2);
                        return NULL;
                    }
                }
                return a;
            }
            else if (child2->type == LB) {
                if (a->kind != ARRAY) { //DONETODO: error expected ARRAY
//                    printf("error expected ARRAY\n");
                    SEMERROR_NOVA(NotArray, child1);
                    return NULL;
                }
                b = SEM_Exp(child3);
                if (b->kind != BASIC || b->basic->type != INT_T) { //DONETODO: error expected int
//                    printf("error expected int\n");
                    char buf[24];
                    if (child(child3, 1)->type == FLOAT) {
                        sprintf(buf, "\"%lg\"", child(child3, 1)->val->fpval);
                    } else
                        strcpy(buf, "Array argument");
                    SEMERROR(NotInteger, child3, buf);
                    return NULL;
                }
                //UNKNOWNTODO: compose array type, REALLY NEED?
                return a->array->type;
            } else { // access struct field
                if (a->kind != STRUCTURE) { //DONETODO: error expected struct
//                    printf("error expected struct\n");
                    SEMERROR_NOVA(NotStruct, child2);
                    return NULL;
                }
                //DONETODO: search each field for ID
                struct field_t *structField = a->structure->field;
                for (; structField; structField = structField->next) {
                    if (strcmp(structField->name, child3->val->idval) == 0) {
                        break;
                    }
                }
                if (structField) {
                    return structField->type;
                } else {
                    SEMERROR(StructHasNoField, child3, child3->val->idval);
                    return NULL;
                }
            }
            break;
        case NOT:
        case MINUS:
            return SEM_Exp(child2);
        case ID:
            a = findvar(child1->val->idval);
            if (!child3) {
                if (a == NULL) { //DONETODO: error not found
                    //printf("error var not found: %s\n", child1->val->idval);
                    SEMERROR(UndefinedVariable, child1, child1->val->idval);
                }
                return a;
            }
            if (a) {
                SEMERROR(NotFunction, child1, child1->val->idval);
                return NULL;
            }
            a = findfunc(child1->val->idval);
            if (a == NULL) { //DONETODO: error func not decl
                //printf("error func not found: %s\n", child1->val->idval);
                SEMERROR(UndefinedFunction, child1, child1->val->idval);
                return a;
            }
            char *s1, *s2;
            if (!isFuncMatch(child1, a, &s1, &s2)) {
                //DONETODO check arg type
                SEMERROR(FunctionArgMismatch, child1, s1, s2);
                free(s1);
                free(s2);
//                return NULL;
            }
            return a;
        case INT:
        case FLOAT:
            a = malloc(sizeof(struct attr));
            a->kind = BASIC;
            a->basic = malloc(sizeof(struct basic_t));
            a->basic->type = child1->type == INT ? INT_T : FLOAT_T;
            a->basic->name = NULL;
            return a;
        case LP:
            return SEM_Exp(child2);
        default:
            break;
    }
    abort();
}